

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O1

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,-1,1,false>>::
makeHouseholder<Eigen::VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>,_1>>
          (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>>
           *this,VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1>
                 *essential,Scalar *tau,RealScalar *beta)

{
  PointerType pdVar1;
  Index size;
  long lVar2;
  long lVar3;
  char *__function;
  ulong uVar4;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>>
  *pMVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  ulong uVar8;
  PointerType pdVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1>
  *pVVar14;
  scalar_sum_op<double,_double> local_151;
  VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1>
  *local_150;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
  local_148;
  undefined8 local_130 [13];
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
  local_c8;
  
  lVar3 = *(long *)this;
  lVar10 = *(long *)(this + 8);
  if (lVar10 < 1 && lVar3 != 0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,
                  "Eigen::MapBase<Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  puVar6 = local_130;
  pMVar5 = this;
  for (lVar2 = 0xc; puVar6 = puVar6 + 1, lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar6 = *(undefined8 *)pMVar5;
    pMVar5 = pMVar5 + 8;
  }
  if (lVar10 < 1) {
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                  ,0x93,
                  "Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  uVar4 = lVar10 - 1;
  pdVar9 = (PointerType)(lVar3 + 8);
  dVar12 = 0.0;
  if (lVar10 != 1) {
    local_c8.m_xpr.
    super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
    .m_data = pdVar9;
    local_c8.m_xpr.
    super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
    .m_rows.m_value = uVar4;
    puVar6 = local_130;
    puVar7 = (undefined8 *)
             &local_c8.m_xpr.
              super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
              .field_0x10;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = *puVar6;
      puVar6 = puVar6 + 1;
      puVar7 = puVar7 + 1;
    }
    local_c8.m_xpr.
    super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
    .m_startRow.m_value = 1;
    local_c8.m_xpr.
    super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
    .m_outerStride = 3;
    if (uVar4 != 0) {
      local_150 = essential;
      local_148.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
      .m_d.argImpl.
      super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
      .
      super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
      .m_data = pdVar9;
      dVar12 = internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,-1,1,false>const,-1,1,false>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const,_1,1,false>const>>
                         (&local_148,&local_151,&local_c8);
      essential = local_150;
    }
  }
  pVVar14 = (VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1>
             *)**(double **)this;
  if (dVar12 <= 2.2250738585072014e-308) {
    *tau = 0.0;
    *beta = (RealScalar)pVVar14;
    uVar4 = (essential->
            super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>
            ).
            super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
            .m_rows.m_value;
    if ((long)uVar4 < 0) {
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
      ;
      goto LAB_00112764;
    }
    pdVar1 = (essential->
             super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>
             ).
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
             .m_data;
    uVar11 = uVar4;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar11 = (ulong)((uint)((ulong)pdVar1 >> 3) & 1), (long)uVar4 <= (long)uVar11)) {
      uVar11 = uVar4;
    }
    lVar3 = uVar4 - uVar11;
    if (0 < (long)uVar11) {
      memset(pdVar1,0,uVar11 * 8);
    }
    lVar10 = (lVar3 - (lVar3 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
    if (1 < lVar3) {
      lVar2 = uVar11 + 2;
      if ((long)(uVar11 + 2) < lVar10) {
        lVar2 = lVar10;
      }
      memset(pdVar1 + uVar11,0,(~uVar11 + lVar2 & 0xfffffffffffffffe) * 8 + 0x10);
    }
    if (uVar4 - lVar10 != 0 && lVar10 <= (long)uVar4) {
      memset(pdVar1 + (lVar3 / 2) * 2U + uVar11,0,(uVar4 - lVar10) * 8);
    }
  }
  else {
    dVar12 = dVar12 + (double)pVVar14 * (double)pVVar14;
    if (dVar12 < 0.0) {
      local_150 = pVVar14;
      dVar12 = sqrt(dVar12);
      pVVar14 = local_150;
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    dVar12 = (double)(~-(ulong)((double)pVVar14 < 0.0) & (ulong)-dVar12 |
                     (ulong)dVar12 & -(ulong)((double)pVVar14 < 0.0));
    *beta = dVar12;
    if (lVar10 < 1) {
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
      ;
LAB_00112764:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,__function);
    }
    uVar11 = (essential->
             super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>
             ).
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
             .m_rows.m_value;
    if (uVar11 != uVar4) {
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseBase.h"
                    ,0x106,
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>, -1, 1>, -1, 1>]"
                   );
    }
    pdVar1 = (essential->
             super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>
             ).
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
             .m_data;
    uVar4 = uVar11;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar4 = (ulong)((uint)((ulong)pdVar1 >> 3) & 1), (long)uVar11 <= (long)uVar4)) {
      uVar4 = uVar11;
    }
    dVar12 = (double)pVVar14 - dVar12;
    lVar3 = uVar11 - uVar4;
    if (0 < (long)uVar4) {
      uVar8 = 0;
      do {
        pdVar1[uVar8] = pdVar9[uVar8] / dVar12;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    uVar8 = (lVar3 - (lVar3 >> 0x3f) & 0xfffffffffffffffeU) + uVar4;
    if (1 < lVar3) {
      do {
        auVar13._8_8_ = dVar12;
        auVar13._0_8_ = dVar12;
        auVar13 = divpd(*(undefined1 (*) [16])(pdVar9 + uVar4),auVar13);
        *(undefined1 (*) [16])(pdVar1 + uVar4) = auVar13;
        uVar4 = uVar4 + 2;
      } while ((long)uVar4 < (long)uVar8);
    }
    if ((long)uVar8 < (long)uVar11) {
      do {
        pdVar1[uVar8] = pdVar9[uVar8] / dVar12;
        uVar8 = uVar8 + 1;
      } while (uVar11 != uVar8);
    }
    *tau = (*beta - (double)pVVar14) / *beta;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::makeHouseholder(
  EssentialPart& essential,
  Scalar& tau,
  RealScalar& beta) const
{
  using std::sqrt;
  using numext::conj;
  
  EIGEN_STATIC_ASSERT_VECTOR_ONLY(EssentialPart)
  VectorBlock<const Derived, EssentialPart::SizeAtCompileTime> tail(derived(), 1, size()-1);
  
  RealScalar tailSqNorm = size()==1 ? RealScalar(0) : tail.squaredNorm();
  Scalar c0 = coeff(0);
  const RealScalar tol = (std::numeric_limits<RealScalar>::min)();

  if(tailSqNorm <= tol && numext::abs2(numext::imag(c0))<=tol)
  {
    tau = RealScalar(0);
    beta = numext::real(c0);
    essential.setZero();
  }
  else
  {
    beta = sqrt(numext::abs2(c0) + tailSqNorm);
    if (numext::real(c0)>=RealScalar(0))
      beta = -beta;
    essential = tail / (c0 - beta);
    tau = conj((beta - c0) / beta);
  }
}